

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::(anonymous_namespace)::readOrder<signed_char,int,rr::(anonymous_namespace)::NormalOrder>
               (Vector<int,_4> *dst,int size,void *ptr)

{
  int *piVar1;
  char local_24;
  char local_23;
  char local_22;
  char local_21;
  void *pvStack_20;
  char aligned [4];
  void *ptr_local;
  int size_local;
  Vector<int,_4> *dst_local;
  
  pvStack_20 = ptr;
  ::deMemcpy(&local_24,ptr,(long)size);
  piVar1 = tcu::Vector<int,_4>::operator[](dst,0);
  *piVar1 = (int)local_24;
  if (1 < size) {
    piVar1 = tcu::Vector<int,_4>::operator[](dst,1);
    *piVar1 = (int)local_23;
  }
  if (2 < size) {
    piVar1 = tcu::Vector<int,_4>::operator[](dst,2);
    *piVar1 = (int)local_22;
  }
  if (3 < size) {
    piVar1 = tcu::Vector<int,_4>::operator[](dst,3);
    *piVar1 = (int)local_21;
  }
  return;
}

Assistant:

inline void readOrder (typename tcu::Vector<DstScalarType, 4>& dst, const int size, const void* ptr)
{
	SrcScalarType aligned[4];
	deMemcpy(aligned, ptr, size * sizeof(SrcScalarType));

				   dst[Order::T0] = DstScalarType(aligned[0]);
	if (size >= 2) dst[Order::T1] = DstScalarType(aligned[1]);
	if (size >= 3) dst[Order::T2] = DstScalarType(aligned[2]);
	if (size >= 4) dst[Order::T3] = DstScalarType(aligned[3]);
}